

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O3

MainLoopResult * __thiscall
Saturation::SaturationAlgorithm::runImpl
          (MainLoopResult *__return_storage_ptr__,SaturationAlgorithm *this)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  char *pcVar4;
  pointer_____offset_0x10___ *ppuVar5;
  size_type __dnew;
  long local_28;
  
  lVar1 = Lib::Timer::elapsedMilliseconds();
  *(undefined4 *)(DAT_00b521c0 + 0x1d0) = 0;
  while( true ) {
    doOneAlgorithmStep(this);
    if ((this->_activationLimit != 0) && (this->_activationLimit < *(uint *)(DAT_00b521c0 + 0x1d0)))
    break;
    if (this->_softTimeLimit != 0) {
      lVar2 = Lib::Timer::elapsedMilliseconds();
      if ((long)(ulong)this->_softTimeLimit <
          (long)(lVar2 / 100 -
                (ulong)(uint)((int)(SUB168(SEXT816(lVar1) * ZEXT816(0xa3d70a3d70a3d70b),8) >> 6) -
                             (SUB164(SEXT816(lVar1) * ZEXT816(0xa3d70a3d70a3d70b),0xc) >> 0x1f)))) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar3 = &PTR_cry_00b3dfc0;
        puVar3[1] = puVar3 + 3;
        local_28 = 0x17;
        pcVar4 = (char *)std::__cxx11::string::_M_create(puVar3 + 1,(ulong)&local_28);
        puVar3[1] = pcVar4;
        puVar3[3] = local_28;
        builtin_strncpy(pcVar4,"The time limit exceeded",0x17);
        puVar3[2] = local_28;
        *(undefined1 *)(puVar3[1] + local_28) = 0;
        *puVar3 = &PTR_cry_00b3f910;
        ppuVar5 = &Lib::TimeLimitExceededException::typeinfo;
LAB_00673709:
        __cxa_throw(puVar3,ppuVar5,Lib::Exception::~Exception);
      }
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar3 = &PTR_cry_00b3dfc0;
  puVar3[1] = puVar3 + 3;
  local_28 = 0x1d;
  pcVar4 = (char *)std::__cxx11::string::_M_create(puVar3 + 1,(ulong)&local_28);
  puVar3[1] = pcVar4;
  puVar3[3] = local_28;
  builtin_strncpy(pcVar4,"The activation limit exceeded",0x1d);
  puVar3[2] = local_28;
  *(undefined1 *)(puVar3[1] + local_28) = 0;
  *puVar3 = &PTR_cry_00b3f8e8;
  ppuVar5 = &Lib::ActivationLimitExceededException::typeinfo;
  goto LAB_00673709;
}

Assistant:

MainLoopResult SaturationAlgorithm::runImpl()
{
  // could be more precise, but we don't care too much
  unsigned startTime = Timer::elapsedDeciseconds();
  try {
    env.statistics->activations = 0;
    while (true) {
      doOneAlgorithmStep(); // will bump env.statistics->activations by one

      if (_activationLimit && env.statistics->activations > _activationLimit) {
        throw ActivationLimitExceededException();
      }
      if(_softTimeLimit && Timer::elapsedDeciseconds() - startTime > _softTimeLimit)
        throw TimeLimitExceededException();
    }
  }
  catch (ThrowableBase&) {
    tryUpdateFinalClauseCount();
    throw;
  }
}